

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O0

string * __thiscall
jbcoin::STBase::getFullText_abi_cxx11_(string *__return_storage_ptr__,STBase *this)

{
  bool bVar1;
  int iVar2;
  string local_50 [55];
  undefined1 local_19;
  STBase *local_18;
  STBase *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (STBase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar2 = (*this->_vptr_STBase[4])();
  if (iVar2 != 0) {
    bVar1 = SField::hasName(this->fName);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)&this->fName->fieldName);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = ");
    }
    (*this->_vptr_STBase[6])(local_50);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STBase::getFullText() const
{
    std::string ret;

    if (getSType () != STI_NOTPRESENT)
    {
        if (fName->hasName ())
        {
            ret = fName->fieldName;
            ret += " = ";
        }

        ret += getText ();
    }

    return ret;
}